

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_column_boundary.cpp
# Opt level: O0

void __thiscall
Boundary_z5_column_with_row_access_other<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>
::test_method(Boundary_z5_column_with_row_access_other<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>
              *this)

{
  pointer *ppIVar1;
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>
  local_90;
  undefined1 local_78 [8];
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>
  matrix;
  Row_container rows;
  undefined1 local_38 [8];
  Column_settings settings;
  Boundary_z5_column_with_row_access_other<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>
  *this_local;
  
  settings._32_8_ = this;
  Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>
  ::Column_zp_settings::Column_zp_settings((Column_zp_settings *)local_38,5);
  column_test_base_boundary_z5_methods<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>
            ();
  ppIVar1 = &matrix.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>_>_>
  ::vector((vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>_>_>
            *)ppIVar1);
  build_base_boundary_column_matrix<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>>>>>
            ((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>
              *)local_78,
             (vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>_>_>
              *)ppIVar1,(Column_settings *)local_38);
  column_test_boundary_methods<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>
            ((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>
              *)local_78);
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>
  ::clear((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>
           *)local_78);
  ppIVar1 = &matrix.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>_>_>
  ::clear((vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>_>_>
           *)ppIVar1);
  build_column_matrix<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>>>>>
            (&local_90,
             (vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>_>_>
              *)ppIVar1,(Column_settings *)local_38);
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>
  ::operator=((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>
               *)local_78,&local_90);
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>
  ::~vector(&local_90);
  column_test_boundary_chain_methods<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,false>>>>
            ((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>
              *)local_78);
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>
  ::~vector((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>
             *)local_78);
  std::
  vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>_>_>
  ::~vector((vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>_>_>
             *)&matrix.
                super__Vector_base<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_false>_>
  ::Column_zp_settings::~Column_zp_settings((Column_zp_settings *)local_38);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Boundary_z5_column_with_row_access_other, Column, z5_only_row_access_columns) {
  typename Column::Column_settings settings(5);
  column_test_base_boundary_z5_methods<Column>();

  typename Column::Master::Row_container rows;  // do not destroy before matrix
  std::vector<Column> matrix = build_base_boundary_column_matrix<Column>(rows, settings);
  column_test_boundary_methods<Column>(matrix);

  matrix.clear();
  rows.clear();
  matrix = build_column_matrix<Column>(rows, settings);
  column_test_boundary_chain_methods<Column>(matrix);
}